

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O3

void __thiscall duckdb::OrderByNode::Serialize(OrderByNode *this,Serializer *serializer)

{
  (*serializer->_vptr_Serializer[2])(serializer,100,"type");
  Serializer::WriteValue<duckdb::OrderType>(serializer,this->type);
  (*serializer->_vptr_Serializer[3])(serializer);
  (*serializer->_vptr_Serializer[2])(serializer,0x65,"null_order");
  Serializer::WriteValue<duckdb::OrderByNullType>(serializer,this->null_order);
  (*serializer->_vptr_Serializer[3])(serializer);
  Serializer::
  WritePropertyWithDefault<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            (serializer,0x66,"expression",&this->expression);
  return;
}

Assistant:

void OrderByNode::Serialize(Serializer &serializer) const {
	serializer.WriteProperty<OrderType>(100, "type", type);
	serializer.WriteProperty<OrderByNullType>(101, "null_order", null_order);
	serializer.WritePropertyWithDefault<unique_ptr<ParsedExpression>>(102, "expression", expression);
}